

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

void __thiscall helics::MessageFederate::~MessageFederate(MessageFederate *this)

{
  ~MessageFederate(this,&VTT);
  Federate::~Federate((Federate *)&this->field_0x10);
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}